

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_3D_C.cpp
# Opt level: O2

void amrex::EB2::build_cells
               (Box *bx,Array4<amrex::EBCellFlag> *cell,Array4<unsigned_int> *fx,
               Array4<unsigned_int> *fy,Array4<unsigned_int> *fz,Array4<double> *apx,
               Array4<double> *apy,Array4<double> *apz,Array4<const_double> *fcx,
               Array4<const_double> *fcy,Array4<const_double> *fcz,Array4<const_double> *m2x,
               Array4<const_double> *m2y,Array4<const_double> *m2z,Array4<double> *vfrac,
               Array4<double> *vcent,Array4<double> *barea,Array4<double> *bcent,
               Array4<double> *bnorm,Array4<amrex::EBCellFlag> *ctmp,Array4<double> *levset,
               Real small_volfrac,Geometry *geom,bool extend_domain_face,bool cover_multiple_cuts,
               int *nsmallcells,int *nmulticuts)

{
  double dVar1;
  double dVar2;
  double dVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  double *pdVar12;
  double *pdVar13;
  double *pdVar14;
  double *pdVar15;
  EBCellFlag *pEVar16;
  uint *puVar17;
  uint *puVar18;
  uint *puVar19;
  EBCellFlag *pEVar20;
  double *pdVar21;
  double dVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  IndexType IVar26;
  bool bVar27;
  int idim;
  int iVar28;
  uint uVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int *piVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  short sVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  int iVar45;
  long lVar46;
  long lVar47;
  long lVar48;
  long lVar49;
  long lVar50;
  int iVar51;
  long lVar52;
  long lVar53;
  long lVar54;
  int iVar55;
  int iVar56;
  uint uVar57;
  long lVar58;
  long lVar59;
  int iVar60;
  long lVar61;
  uint uVar62;
  int iVar63;
  long lVar64;
  uint uVar65;
  uint uVar66;
  uint uVar67;
  int iVar68;
  long lVar69;
  long lVar70;
  long lVar71;
  long lVar72;
  long lVar73;
  long lVar74;
  long lVar75;
  double dVar76;
  double dVar77;
  double dVar78;
  double dVar79;
  double dVar80;
  double dVar81;
  double dVar82;
  double dVar83;
  double dVar84;
  double dVar85;
  double dVar86;
  double dVar87;
  double dVar88;
  double dVar89;
  double dVar90;
  double dVar91;
  double dVar92;
  double dVar93;
  double dVar94;
  double dVar95;
  double dVar96;
  double dVar97;
  double dVar98;
  double dVar99;
  int local_350;
  int local_340;
  Box result;
  Box gdomain;
  Box bx_4;
  Box bx_3;
  Box bx_2;
  Buffer<int,_0> n_smallcell_multicuts;
  
  n_smallcell_multicuts.m_size = 2;
  n_smallcell_multicuts.d_data = (int *)0x0;
  piVar34 = (int *)malloc(8);
  piVar34[0] = 0;
  piVar34[1] = 0;
  uVar23 = *(undefined8 *)(bx->smallend).vect;
  uVar24 = *(undefined8 *)(bx->bigend).vect;
  uVar25 = *(undefined8 *)((bx->bigend).vect + 2);
  result.smallend.vect[2] = (int)*(undefined8 *)((bx->smallend).vect + 2);
  iVar30 = result.smallend.vect[2];
  result.bigend.vect[0] = (int)uVar24;
  iVar32 = result.bigend.vect[0];
  result.bigend.vect[1] = (int)((ulong)uVar24 >> 0x20);
  result.smallend.vect[0] = (int)uVar23;
  iVar63 = result.smallend.vect[0];
  result.smallend.vect[1] = (int)((ulong)uVar23 >> 0x20);
  iVar31 = result.smallend.vect[1];
  iVar45 = result.smallend.vect[0] + -1;
  iVar28 = result.smallend.vect[1] + -1;
  result.smallend.vect[1] = iVar28;
  result.smallend.vect[0] = iVar45;
  result.smallend.vect[2] = result.smallend.vect[2] + -1;
  iVar55 = result.bigend.vect[0] + 1;
  result.bigend.vect[0] = iVar55;
  result.bigend.vect[2] = (int)uVar25;
  iVar56 = result.bigend.vect[1] + 1;
  result.bigend.vect[1] = iVar56;
  iVar60 = result.bigend.vect[2] + 1;
  result.btype.itype = (uint)((ulong)uVar25 >> 0x20);
  result.bigend.vect[2] = iVar60;
  lVar42 = (long)iVar45;
  lVar43 = lVar42 * 8;
  lVar38 = (long)result.smallend.vect[2];
  n_smallcell_multicuts.h_data = piVar34;
  while ((int)lVar38 <= iVar60) {
    lVar35 = (long)iVar30;
    iVar33 = iVar31;
    for (lVar70 = (long)iVar28; (int)lVar70 <= iVar56; lVar70 = lVar70 + 1) {
      if (iVar45 <= iVar55) {
        lVar36 = (long)iVar33;
        lVar64 = 0;
        do {
          uVar29 = cell->p[((lVar38 - (cell->begin).z) * cell->kstride +
                           (lVar70 - (cell->begin).y) * cell->jstride + lVar42 + lVar64) -
                           (long)(cell->begin).x].flag & 3;
          if (uVar29 == 3) {
            vfrac->p[((lVar38 - (vfrac->begin).z) * vfrac->kstride +
                     (lVar70 - (vfrac->begin).y) * vfrac->jstride + lVar42 + lVar64) -
                     (long)(vfrac->begin).x] = 0.0;
            lVar46 = (lVar38 - (vcent->begin).z) * vcent->kstride;
            lVar44 = (lVar70 - (vcent->begin).y) * vcent->jstride;
            lVar37 = (long)(vcent->begin).x;
            pdVar12 = vcent->p;
            pdVar12[lVar42 + ((lVar46 + lVar44 + lVar64) - lVar37)] = 0.0;
            lVar47 = vcent->nstride;
            pdVar12[lVar42 + ((lVar47 + lVar46 + lVar44 + lVar64) - lVar37)] = 0.0;
            pdVar12[lVar42 + ((lVar46 + lVar44 + lVar47 * 2 + lVar64) - lVar37)] = 0.0;
            lVar37 = (long)(bcent->begin).x;
            lVar46 = (lVar38 - (bcent->begin).z) * bcent->kstride;
            lVar44 = (lVar70 - (bcent->begin).y) * bcent->jstride;
            pdVar12 = bcent->p;
            pdVar12[lVar42 + ((lVar46 + lVar44 + lVar64) - lVar37)] = -1.0;
            lVar47 = bcent->nstride;
            pdVar12[lVar42 + ((lVar47 + lVar46 + lVar44 + lVar64) - lVar37)] = -1.0;
            pdVar12[lVar42 + ((lVar46 + lVar44 + lVar47 * 2 + lVar64) - lVar37)] = -1.0;
            lVar46 = (lVar38 - (bnorm->begin).z) * bnorm->kstride;
            lVar44 = (lVar70 - (bnorm->begin).y) * bnorm->jstride;
            lVar37 = (long)(bnorm->begin).x;
            pdVar12 = bnorm->p;
            pdVar12[lVar42 + ((lVar46 + lVar44 + lVar64) - lVar37)] = 0.0;
            lVar47 = bnorm->nstride;
            pdVar12[lVar42 + ((lVar47 + lVar46 + lVar44 + lVar64) - lVar37)] = 0.0;
            pdVar12[lVar42 + ((lVar46 + lVar44 + lVar47 * 2 + lVar64) - lVar37)] = 0.0;
            barea->p[((lVar38 - (barea->begin).z) * barea->kstride +
                     (lVar70 - (barea->begin).y) * barea->jstride + lVar42 + lVar64) -
                     (long)(barea->begin).x] = 0.0;
          }
          else if (uVar29 == 0) {
            vfrac->p[((lVar38 - (vfrac->begin).z) * vfrac->kstride +
                     (lVar70 - (vfrac->begin).y) * vfrac->jstride + lVar42 + lVar64) -
                     (long)(vfrac->begin).x] = 1.0;
            lVar46 = (lVar38 - (vcent->begin).z) * vcent->kstride;
            lVar44 = (lVar70 - (vcent->begin).y) * vcent->jstride;
            lVar37 = (long)(vcent->begin).x;
            pdVar12 = vcent->p;
            pdVar12[lVar42 + ((lVar46 + lVar44 + lVar64) - lVar37)] = 0.0;
            lVar47 = vcent->nstride;
            pdVar12[lVar42 + ((lVar47 + lVar46 + lVar44 + lVar64) - lVar37)] = 0.0;
            pdVar12[lVar42 + ((lVar46 + lVar44 + lVar47 * 2 + lVar64) - lVar37)] = 0.0;
            lVar37 = (long)(bcent->begin).x;
            lVar46 = (lVar38 - (bcent->begin).z) * bcent->kstride;
            lVar44 = (lVar70 - (bcent->begin).y) * bcent->jstride;
            pdVar12 = bcent->p;
            pdVar12[lVar42 + ((lVar46 + lVar44 + lVar64) - lVar37)] = -1.0;
            lVar47 = bcent->nstride;
            pdVar12[lVar42 + ((lVar47 + lVar46 + lVar44 + lVar64) - lVar37)] = -1.0;
            pdVar12[lVar42 + ((lVar46 + lVar44 + lVar47 * 2 + lVar64) - lVar37)] = -1.0;
            lVar46 = (lVar38 - (bnorm->begin).z) * bnorm->kstride;
            lVar44 = (lVar70 - (bnorm->begin).y) * bnorm->jstride;
            lVar37 = (long)(bnorm->begin).x;
            pdVar12 = bnorm->p;
            pdVar12[lVar42 + ((lVar46 + lVar44 + lVar64) - lVar37)] = 0.0;
            lVar47 = bnorm->nstride;
            pdVar12[lVar42 + ((lVar47 + lVar46 + lVar44 + lVar64) - lVar37)] = 0.0;
            pdVar12[lVar42 + ((lVar46 + lVar44 + lVar47 * 2 + lVar64) - lVar37)] = 0.0;
            barea->p[((lVar38 - (barea->begin).z) * barea->kstride +
                     (lVar70 - (barea->begin).y) * barea->jstride + lVar42 + lVar64) -
                     (long)(barea->begin).x] = 0.0;
          }
          else {
            iVar51 = (apx->begin).x;
            lVar47 = (long)(apx->begin).y;
            lVar53 = (long)(int)lVar70;
            lVar44 = (long)(apx->begin).z;
            lVar37 = (long)(int)lVar38;
            iVar68 = (int)lVar64;
            dVar1 = apx->p[lVar42 + (((lVar38 - lVar44) * apx->kstride +
                                     (lVar70 - lVar47) * apx->jstride + lVar64) - (long)iVar51)];
            dVar77 = apx->p[(lVar53 - lVar47) * apx->jstride +
                            (long)((iVar63 + iVar68) - iVar51) + (lVar37 - lVar44) * apx->kstride];
            lVar47 = (long)(apy->begin).x;
            lVar44 = (long)(apy->begin).y;
            lVar58 = (lVar38 - (apy->begin).z) * apy->kstride;
            lVar46 = apy->jstride * 8;
            dVar2 = *(double *)
                     ((long)apy->p +
                     lVar64 * 8 + (lVar70 - lVar44) * lVar46 + lVar58 * 8 + lVar47 * -8 + lVar43);
            dVar3 = *(double *)
                     ((long)apy->p +
                     lVar64 * 8 + (lVar36 - lVar44) * lVar46 + lVar58 * 8 + lVar47 * -8 + lVar43);
            lVar47 = (long)(apz->begin).x;
            lVar44 = (long)(apz->begin).z;
            lVar46 = apz->kstride * 8;
            lVar58 = (lVar70 - (apz->begin).y) * apz->jstride;
            dVar78 = *(double *)
                      ((long)apz->p +
                      lVar64 * 8 + (lVar38 - lVar44) * lVar46 + lVar58 * 8 + lVar47 * -8 + lVar43);
            dVar79 = *(double *)
                      ((long)apz->p +
                      lVar64 * 8 + (lVar35 - lVar44) * lVar46 + lVar58 * 8 + lVar47 * -8 + lVar43);
            if ((((((dVar1 < 0.5) || (1.0 <= dVar1)) || (dVar77 < 0.5)) ||
                 ((1.0 <= dVar77 || (dVar2 < 0.5)))) ||
                ((1.0 <= dVar2 || ((dVar3 < 0.5 || (1.0 <= dVar3)))))) ||
               ((dVar78 < 0.5 || (((1.0 <= dVar78 || (dVar79 < 0.5)) || (1.0 <= dVar79)))))) {
              dVar76 = dVar1 - dVar77;
              dVar22 = dVar2 - dVar3;
              dVar85 = dVar78 - dVar79;
              dVar89 = SQRT(dVar85 * dVar85 + dVar76 * dVar76 + dVar22 * dVar22);
              if ((dVar89 == 0.0) && (!NAN(dVar89))) {
                Assert_host("apnorm != 0.0_rt",
                            "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/EB/AMReX_EB2_3D_C.cpp"
                            ,0x44,"\"amrex::EB2:build_cells: apnorm==0\"");
              }
              dVar89 = 1.0 / dVar89;
              dVar91 = dVar76 * dVar89;
              dVar86 = dVar22 * dVar89;
              dVar89 = dVar89 * dVar85;
              lVar58 = (lVar38 - (bnorm->begin).z) * bnorm->kstride;
              lVar46 = (lVar70 - (bnorm->begin).y) * bnorm->jstride;
              lVar44 = (long)(bnorm->begin).x;
              pdVar12 = bnorm->p;
              pdVar12[lVar42 + ((lVar58 + lVar46 + lVar64) - lVar44)] = dVar91;
              lVar47 = bnorm->nstride;
              pdVar12[lVar42 + ((lVar47 + lVar58 + lVar46 + lVar64) - lVar44)] = dVar86;
              pdVar12[lVar42 + ((lVar58 + lVar46 + lVar47 * 2 + lVar64) - lVar44)] = dVar89;
              barea->p[((lVar38 - (barea->begin).z) * barea->kstride +
                       (lVar70 - (barea->begin).y) * barea->jstride + lVar42 + lVar64) -
                       (long)(barea->begin).x] = dVar85 * dVar89 + dVar76 * dVar91 + dVar22 * dVar86
              ;
              lVar59 = (long)(fcy->begin).x;
              lVar44 = (long)(fcy->begin).y;
              lVar58 = (lVar38 - (fcy->begin).z) * fcy->kstride;
              lVar46 = fcy->jstride * 8;
              lVar47 = (lVar70 - lVar44) * lVar46 + lVar58 * 8;
              pdVar13 = fcy->p;
              lVar44 = (lVar36 - lVar44) * lVar46 + lVar58 * 8;
              lVar54 = (long)(fcz->begin).x;
              lVar50 = fcz->jstride;
              lVar58 = (long)(fcz->begin).z;
              lVar69 = fcz->kstride * 8;
              lVar48 = (lVar38 - lVar58) * lVar69;
              lVar71 = (lVar70 - (fcz->begin).y) * lVar50;
              lVar46 = lVar48 + lVar71 * 8;
              pdVar14 = fcz->p;
              lVar69 = (lVar35 - lVar58) * lVar69;
              lVar58 = lVar69 + lVar71 * 8;
              lVar71 = (long)(fcx->begin).y;
              lVar49 = (long)(fcx->begin).z;
              lVar72 = (lVar38 - lVar49) * fcx->kstride;
              lVar52 = (lVar70 - lVar71) * fcx->jstride;
              pdVar15 = fcx->p;
              iVar51 = (fcx->begin).x;
              lVar73 = (long)iVar51;
              pdVar12 = pdVar15 + (lVar53 - lVar71) * fcx->jstride +
                                  (long)((iVar63 + iVar68) - iVar51) +
                                  (lVar37 - lVar49) * fcx->kstride;
              dVar81 = (dVar77 + dVar1) * 0.5;
              dVar83 = (dVar79 + dVar78) * 0.5;
              dVar22 = (*(double *)((long)pdVar14 + lVar64 * 8 + lVar46 + lVar54 * -8 + lVar43) *
                        dVar78 - *(double *)
                                  ((long)pdVar14 + lVar64 * 8 + lVar58 + lVar54 * -8 + lVar43) *
                                 dVar79) * dVar89 +
                       ((*(double *)((long)pdVar13 + lVar64 * 8 + lVar47 + lVar59 * -8 + lVar43) *
                         dVar2 - *(double *)
                                  ((long)pdVar13 + lVar64 * 8 + lVar44 + lVar59 * -8 + lVar43) *
                                 dVar3) * dVar86 - dVar81 * dVar91);
              dVar76 = (dVar2 + dVar3) * 0.5;
              dVar85 = (*(double *)
                         ((long)pdVar14 +
                         lVar64 * 8 + lVar46 + fcz->nstride * 8 + lVar54 * -8 + lVar43) * dVar78 -
                       *(double *)
                        ((long)pdVar14 +
                        lVar64 * 8 + lVar58 + fcz->nstride * 8 + lVar54 * -8 + lVar43) * dVar79) *
                       dVar89 + ((pdVar15[lVar42 + ((lVar52 + lVar72 + lVar64) - lVar73)] * dVar1 -
                                 *pdVar12 * dVar77) * dVar91 - dVar76 * dVar86);
              dVar80 = (*(double *)
                         ((long)pdVar13 +
                         lVar64 * 8 + lVar47 + fcy->nstride * 8 + lVar59 * -8 + lVar43) * dVar2 -
                       *(double *)
                        ((long)pdVar13 +
                        lVar64 * 8 + lVar44 + fcy->nstride * 8 + lVar59 * -8 + lVar43) * dVar3) *
                       dVar86 + ((pdVar15[lVar42 + ((fcx->nstride + lVar52 + lVar72 + lVar64) -
                                                   lVar73)] * dVar1 - pdVar12[fcx->nstride] * dVar77
                                 ) * dVar91 - dVar83 * dVar89);
              lVar46 = (lVar38 - (vfrac->begin).z) * vfrac->kstride;
              lVar47 = (lVar70 - (vfrac->begin).y) * vfrac->jstride;
              lVar44 = (long)(vfrac->begin).x;
              dVar76 = (dVar89 * dVar80 +
                       dVar86 * dVar85 + dVar91 * dVar22 + dVar81 + dVar76 + dVar83) * 0.5;
              pdVar13 = vfrac->p;
              pdVar13[(lVar46 + lVar47 + lVar42 + lVar64) - lVar44] = dVar76;
              if (small_volfrac <= dVar76) {
                dVar81 = 1.0 / barea->p[((lVar38 - (barea->begin).z) * barea->kstride +
                                        (lVar70 - (barea->begin).y) * barea->jstride +
                                        lVar42 + lVar64) - (long)(barea->begin).x];
                lVar71 = (long)(bcent->begin).x;
                lVar54 = (lVar38 - (bcent->begin).z) * bcent->kstride;
                lVar49 = (lVar70 - (bcent->begin).y) * bcent->jstride;
                pdVar14 = bcent->p;
                pdVar14[lVar42 + ((lVar54 + lVar49 + lVar64) - lVar71)] =
                     (dVar76 * dVar91 + dVar22) * dVar81;
                lVar58 = bcent->nstride;
                pdVar14[lVar42 + ((lVar58 + lVar54 + lVar49 + lVar64) - lVar71)] =
                     (pdVar13[(lVar46 + lVar47 + lVar42 + lVar64) - lVar44] * dVar86 + dVar85) *
                     dVar81;
                pdVar14[lVar42 + ((lVar54 + lVar49 + lVar58 * 2 + lVar64) - lVar71)] =
                     (pdVar13[(lVar46 + lVar47 + lVar42 + lVar64) - lVar44] * dVar89 + dVar80) *
                     dVar81;
                lVar71 = (long)(fcy->begin).x;
                lVar46 = (long)(fcy->begin).y;
                lVar44 = (lVar38 - (fcy->begin).z) * fcy->kstride;
                lVar58 = fcy->jstride * 8;
                lVar47 = (lVar36 - lVar46) * lVar58 + lVar44 * 8;
                pdVar13 = fcy->p;
                lVar44 = (lVar70 - lVar46) * lVar58 + lVar44 * 8;
                lVar50 = lVar50 * (lVar70 - (fcz->begin).y);
                lVar46 = (long)(fcz->begin).x;
                lVar69 = lVar69 + lVar50 * 8;
                lVar48 = lVar48 + lVar50 * 8;
                pdVar14 = fcz->p;
                dVar80 = *(double *)((long)pdVar13 + lVar64 * 8 + lVar47 + lVar71 * -8 + lVar43) *
                         dVar3 + *(double *)
                                  ((long)pdVar13 + lVar64 * 8 + lVar44 + lVar71 * -8 + lVar43) *
                                 dVar2;
                dVar87 = *(double *)((long)pdVar14 + lVar64 * 8 + lVar69 + lVar46 * -8 + lVar43) *
                         dVar79 + *(double *)
                                   ((long)pdVar14 + lVar64 * 8 + lVar48 + lVar46 * -8 + lVar43) *
                                  dVar78;
                dVar22 = dVar87 * 0.5 + (dVar77 - dVar1) * 0.5 + dVar80 * 0.5;
                dVar84 = *pdVar12 * dVar77 +
                         pdVar15[lVar42 + ((lVar52 + lVar72 + lVar64) - lVar73)] * dVar1;
                dVar82 = *(double *)
                          ((long)pdVar14 +
                          lVar64 * 8 + lVar69 + fcz->nstride * 8 + lVar46 * -8 + lVar43) * dVar79 +
                         *(double *)
                          ((long)pdVar14 +
                          lVar64 * 8 + fcz->nstride * 8 + lVar48 + lVar46 * -8 + lVar43) * dVar78;
                dVar81 = dVar82 * 0.5 + dVar84 * 0.5 + (dVar3 - dVar2) * 0.5;
                dVar98 = dVar77 * pdVar12[fcx->nstride] +
                         dVar1 * pdVar15[lVar42 + ((fcx->nstride + lVar52 + lVar72 + lVar64) -
                                                  lVar73)];
                dVar92 = dVar3 * *(double *)
                                  ((long)pdVar13 +
                                  lVar64 * 8 + lVar47 + fcy->nstride * 8 + lVar71 * -8 + lVar43) +
                         dVar2 * *(double *)
                                  ((long)pdVar13 +
                                  lVar64 * 8 + lVar44 + fcy->nstride * 8 + lVar71 * -8 + lVar43);
                dVar76 = (dVar79 - dVar78) * 0.5 + dVar98 * 0.5 + dVar92 * 0.5;
                dVar85 = -dVar86;
                lVar49 = (long)(m2y->begin).x;
                lVar44 = (long)(m2y->begin).y;
                lVar46 = (lVar38 - (m2y->begin).z) * m2y->kstride;
                lVar58 = m2y->jstride * 8;
                lVar47 = (lVar36 - lVar44) * lVar58 + lVar46 * 8;
                pdVar12 = m2y->p;
                lVar44 = (lVar70 - lVar44) * lVar58 + lVar46 * 8;
                dVar83 = -dVar89;
                lVar48 = (long)(m2z->begin).x;
                lVar69 = (long)(m2z->begin).z;
                lVar58 = (lVar70 - (m2z->begin).y) * m2z->jstride;
                lVar50 = m2z->kstride * 8;
                lVar46 = (lVar35 - lVar69) * lVar50 + lVar58 * 8;
                pdVar13 = m2z->p;
                lVar58 = (lVar38 - lVar69) * lVar50 + lVar58 * 8;
                dVar95 = (*(double *)((long)pdVar13 + lVar64 * 8 + lVar46 + lVar48 * -8 + lVar43) -
                         *(double *)((long)pdVar13 + lVar64 * 8 + lVar58 + lVar48 * -8 + lVar43)) *
                         dVar83 + dVar91 * -0.25 * (dVar77 - dVar1) +
                                  (*(double *)
                                    ((long)pdVar12 + lVar64 * 8 + lVar47 + lVar49 * -8 + lVar43) -
                                  *(double *)
                                   ((long)pdVar12 + lVar64 * 8 + lVar44 + lVar49 * -8 + lVar43)) *
                                  dVar85;
                iVar51 = (m2x->begin).x;
                lVar52 = (long)iVar51;
                lVar59 = (long)((iVar63 + iVar68) - iVar51);
                lVar69 = (long)(m2x->begin).y;
                pdVar14 = m2x->p;
                lVar50 = (lVar53 - lVar69) * m2x->jstride;
                lVar53 = (long)(m2x->begin).z;
                lVar71 = (lVar37 - lVar53) * m2x->kstride;
                lVar54 = (lVar38 - lVar53) * m2x->kstride;
                dVar77 = -dVar91;
                lVar72 = (lVar70 - lVar69) * m2x->jstride;
                lVar37 = m2z->nstride;
                dVar93 = (*(double *)
                           ((long)pdVar13 + lVar64 * 8 + lVar46 + lVar37 * 8 + lVar48 * -8 + lVar43)
                         - *(double *)
                            ((long)pdVar13 + lVar64 * 8 + lVar58 + lVar37 * 8 + lVar48 * -8 + lVar43
                            )) * dVar83 +
                         (pdVar14[lVar50 + lVar59 + lVar71] -
                         pdVar14[lVar42 + ((lVar72 + lVar54 + lVar64) - lVar52)]) * dVar77 +
                         dVar86 * -0.25 * (dVar3 - dVar2);
                lVar53 = m2x->nstride;
                lVar69 = m2y->nstride;
                dVar1 = dVar89 * -0.25 * (dVar79 - dVar78) +
                        (pdVar14[lVar50 + lVar59 + lVar71 + lVar53] -
                        pdVar14[lVar42 + ((lVar72 + lVar54 + lVar53 + lVar64) - lVar52)]) * dVar77 +
                        (*(double *)
                          ((long)pdVar12 + lVar64 * 8 + lVar47 + lVar69 * 8 + lVar49 * -8 + lVar43)
                        - *(double *)
                           ((long)pdVar12 + lVar64 * 8 + lVar44 + lVar69 * 8 + lVar49 * -8 + lVar43)
                        ) * dVar85;
                dVar88 = (*(double *)
                           ((long)pdVar13 +
                           lVar64 * 8 + lVar46 + lVar37 * 0x10 + lVar48 * -8 + lVar43) -
                         *(double *)
                          ((long)pdVar13 +
                          lVar64 * 8 + lVar37 * 0x10 + lVar58 + lVar48 * -8 + lVar43)) * dVar83 +
                         dVar84 * dVar91 * -0.5 + dVar80 * dVar86 * -0.5;
                dVar84 = dVar87 * dVar89 * -0.5 +
                         dVar91 * -0.5 * dVar98 +
                         (*(double *)
                           ((long)pdVar12 +
                           lVar64 * 8 + lVar47 + lVar69 * 0x10 + lVar49 * -8 + lVar43) -
                         *(double *)
                          ((long)pdVar12 +
                          lVar64 * 8 + lVar69 * 0x10 + lVar44 + lVar49 * -8 + lVar43)) * dVar85;
                dVar94 = dVar89 * -0.5 * dVar82 +
                         (pdVar14[lVar50 + lVar59 + lVar71 + lVar53 * 2] -
                         pdVar14[lVar42 + ((lVar72 + lVar54 + lVar53 * 2 + lVar64) - lVar52)]) *
                         dVar77 + dVar86 * -0.5 * dVar92;
                dVar87 = dVar86 * dVar86;
                dVar78 = dVar87 * -3.0 + 5.0;
                dVar83 = dVar87 + dVar87;
                dVar96 = dVar86 * dVar86 * dVar87;
                dVar85 = dVar89 * dVar89;
                dVar77 = dVar84 * 5.0 * (dVar87 + -2.0) - dVar91 * dVar94 * dVar86;
                dVar80 = dVar89 * dVar85;
                dVar82 = dVar89 * dVar80;
                dVar79 = (dVar88 + dVar88) * dVar91;
                dVar97 = dVar22 * dVar91;
                dVar99 = dVar93 * -4.0 + dVar95 + dVar1;
                dVar98 = dVar1 * -4.0 + dVar93 + dVar95;
                dVar92 = dVar76 * dVar86 + (dVar87 * -3.0 + 4.0) * dVar94;
                dVar2 = dVar88 * dVar91 + dVar81;
                dVar90 = (dVar98 + dVar98) * dVar87 + dVar2 * dVar86 + dVar95 * -5.0 + dVar1 * 15.0;
                dVar3 = 1.0 / ((vfrac->p[((lVar38 - (vfrac->begin).z) * vfrac->kstride +
                                         (lVar70 - (vfrac->begin).y) * vfrac->jstride +
                                         lVar42 + lVar64) - (long)(vfrac->begin).x] + 1e-30) *
                              ((dVar85 * -3.0 + 2.0 + dVar82) * dVar83 +
                              (dVar85 + -2.0) * (dVar96 + dVar96) +
                              dVar82 * -4.0 + dVar85 * 4.0 + 5.0) * 10.0);
                lVar37 = (long)(vcent->begin).x;
                lVar46 = (lVar38 - (vcent->begin).z) * vcent->kstride;
                lVar44 = (lVar70 - (vcent->begin).y) * vcent->jstride;
                pdVar12 = vcent->p;
                pdVar12[lVar42 + ((lVar46 + lVar44 + lVar64) - lVar37)] =
                     (dVar86 * (dVar88 + dVar88) * dVar82 +
                     (dVar77 + dVar77) * dVar80 +
                     ((dVar87 * 8.0 + -15.0) * dVar22 +
                     ((dVar95 * 16.0 + (dVar93 + dVar1) * -4.0) * dVar91 + dVar88 * 10.0 * dVar86) *
                     dVar87 + dVar88 * -22.0 * dVar86 +
                              dVar91 * -2.0 * (dVar81 * dVar86 + dVar95 * 15.0 + dVar1 * -5.0)) *
                     dVar85 + ((((dVar93 + dVar93) * dVar86 + dVar81) * dVar91 +
                               (dVar87 * -4.0 + 6.0) * dVar88) * dVar86 +
                              dVar78 * dVar22 + dVar91 * (dVar95 + dVar95) * dVar78) * 5.0 +
                              ((dVar87 * -11.0 + 15.0 + dVar96) * (dVar84 + dVar84) +
                              ((5.0 - dVar83) * dVar76 + dVar94 * -2.0 * dVar86 * (dVar87 + -5.0)) *
                              dVar91) * dVar89) * dVar3;
                lVar47 = vcent->nstride;
                pdVar12[lVar42 + ((lVar47 + lVar46 + lVar44 + lVar64) - lVar37)] =
                     (dVar94 * -8.0 * dVar89 * dVar82 +
                     (dVar2 * -8.0 + dVar99 * 4.0 * dVar86) * dVar82 +
                     (dVar92 + dVar92) * dVar80 +
                     (((dVar99 + dVar99) * dVar87 +
                      ((dVar1 * 3.0 + dVar95 * -7.0 + dVar93 * 8.0) - dVar97)) * (dVar86 + dVar86) +
                     (dVar87 * -5.0 + 4.0) * dVar79 + dVar81 * -8.0 * (dVar87 + -1.0)) * dVar85 +
                     (((dVar87 * 6.0 + 4.0) * dVar93 + dVar95 * -2.0 * (dVar87 + -1.0) + dVar97) *
                      dVar86 + (dVar83 + 1.0) * dVar79 + (dVar87 * 3.0 + 2.0) * dVar81) * 5.0 +
                     ((dVar87 * 9.0 + 5.0 + dVar96) * (dVar94 + dVar94) +
                     ((dVar83 + 3.0) * dVar76 + (dVar87 + 4.0) * (dVar84 + dVar84) * dVar91) *
                     dVar86) * dVar89) * dVar3;
                pdVar12[lVar42 + ((lVar46 + lVar44 + lVar47 * 2 + lVar64) - lVar37)] =
                     dVar3 * ((dVar94 + dVar94) * dVar86 * dVar82 +
                             (dVar90 + dVar90) * dVar80 +
                             (dVar84 * -10.0 * dVar91 * (dVar87 + -2.0) +
                             (dVar87 * -8.0 + 15.0) * dVar76 +
                             dVar94 * -6.0 * dVar86 * (dVar87 + -3.0)) * dVar85 +
                             (dVar98 * 4.0 * dVar96 +
                             (dVar81 + dVar81) * dVar86 * dVar87 +
                             (dVar1 * -8.0 + dVar95 * 7.0 + dVar93 * -3.0 + dVar97) * -2.0 * dVar87
                             + (dVar1 * 4.0 + dVar95 + dVar95 + dVar97) * 5.0 +
                               (dVar81 * 3.0 + dVar88 * 8.0 * dVar91) * dVar86) * dVar89 +
                             (dVar96 * 4.0 + dVar87 * -4.0 + -5.0) *
                             (dVar94 * dVar86 + dVar84 * dVar91 + dVar76) * -2.0);
              }
              else {
                pdVar13[(lVar46 + lVar47 + lVar42 + lVar64) - lVar44] = 0.0;
                lVar46 = (lVar38 - (vcent->begin).z) * vcent->kstride;
                lVar44 = (lVar70 - (vcent->begin).y) * vcent->jstride;
                lVar37 = (long)(vcent->begin).x;
                pdVar12 = vcent->p;
                pdVar12[lVar42 + ((lVar46 + lVar44 + lVar64) - lVar37)] = 0.0;
                lVar47 = vcent->nstride;
                pdVar12[lVar42 + ((lVar47 + lVar46 + lVar44 + lVar64) - lVar37)] = 0.0;
                pdVar12[lVar42 + ((lVar46 + lVar44 + lVar47 * 2 + lVar64) - lVar37)] = 0.0;
                lVar37 = (long)(bcent->begin).x;
                lVar46 = (lVar38 - (bcent->begin).z) * bcent->kstride;
                lVar44 = (lVar70 - (bcent->begin).y) * bcent->jstride;
                pdVar12 = bcent->p;
                pdVar12[lVar42 + ((lVar46 + lVar44 + lVar64) - lVar37)] = -1.0;
                lVar47 = bcent->nstride;
                pdVar12[lVar42 + ((lVar47 + lVar46 + lVar44 + lVar64) - lVar37)] = -1.0;
                pdVar12[lVar42 + ((lVar46 + lVar44 + lVar47 * 2 + lVar64) - lVar37)] = -1.0;
                lVar46 = (lVar38 - (bnorm->begin).z) * bnorm->kstride;
                lVar44 = (lVar70 - (bnorm->begin).y) * bnorm->jstride;
                lVar37 = (long)(bnorm->begin).x;
                pdVar12 = bnorm->p;
                pdVar12[lVar42 + ((lVar46 + lVar44 + lVar64) - lVar37)] = 0.0;
                lVar47 = bnorm->nstride;
                pdVar12[lVar42 + ((lVar47 + lVar46 + lVar44 + lVar64) - lVar37)] = 0.0;
                pdVar12[lVar42 + ((lVar46 + lVar44 + lVar47 * 2 + lVar64) - lVar37)] = 0.0;
                barea->p[((lVar38 - (barea->begin).z) * barea->kstride +
                         (lVar70 - (barea->begin).y) * barea->jstride + lVar42 + lVar64) -
                         (long)(barea->begin).x] = 0.0;
                cell->p[((lVar38 - (cell->begin).z) * cell->kstride +
                        (lVar70 - (cell->begin).y) * cell->jstride + lVar42 + lVar64) -
                        (long)(cell->begin).x].flag = 0x40003;
                *piVar34 = *piVar34 + 1;
              }
            }
            else {
              vfrac->p[((lVar38 - (vfrac->begin).z) * vfrac->kstride +
                       (lVar70 - (vfrac->begin).y) * vfrac->jstride + lVar42 + lVar64) -
                       (long)(vfrac->begin).x] = 0.0;
              lVar46 = (lVar38 - (vcent->begin).z) * vcent->kstride;
              lVar44 = (lVar70 - (vcent->begin).y) * vcent->jstride;
              lVar37 = (long)(vcent->begin).x;
              pdVar12 = vcent->p;
              pdVar12[lVar42 + ((lVar46 + lVar44 + lVar64) - lVar37)] = 0.0;
              lVar47 = vcent->nstride;
              pdVar12[lVar42 + ((lVar47 + lVar46 + lVar44 + lVar64) - lVar37)] = 0.0;
              pdVar12[lVar42 + ((lVar46 + lVar44 + lVar47 * 2 + lVar64) - lVar37)] = 0.0;
              lVar37 = (long)(bcent->begin).x;
              lVar46 = (lVar38 - (bcent->begin).z) * bcent->kstride;
              lVar44 = (lVar70 - (bcent->begin).y) * bcent->jstride;
              pdVar12 = bcent->p;
              pdVar12[lVar42 + ((lVar46 + lVar44 + lVar64) - lVar37)] = -1.0;
              lVar47 = bcent->nstride;
              pdVar12[lVar42 + ((lVar47 + lVar46 + lVar44 + lVar64) - lVar37)] = -1.0;
              pdVar12[lVar42 + ((lVar46 + lVar44 + lVar47 * 2 + lVar64) - lVar37)] = -1.0;
              lVar46 = (lVar38 - (bnorm->begin).z) * bnorm->kstride;
              lVar44 = (lVar70 - (bnorm->begin).y) * bnorm->jstride;
              lVar37 = (long)(bnorm->begin).x;
              pdVar12 = bnorm->p;
              pdVar12[lVar42 + ((lVar46 + lVar44 + lVar64) - lVar37)] = 0.0;
              lVar47 = bnorm->nstride;
              pdVar12[lVar42 + ((lVar47 + lVar46 + lVar44 + lVar64) - lVar37)] = 0.0;
              pdVar12[lVar42 + ((lVar46 + lVar44 + lVar47 * 2 + lVar64) - lVar37)] = 0.0;
              barea->p[((lVar38 - (barea->begin).z) * barea->kstride +
                       (lVar70 - (barea->begin).y) * barea->jstride + lVar42 + lVar64) -
                       (long)(barea->begin).x] = 0.0;
              cell->p[((lVar38 - (cell->begin).z) * cell->kstride +
                      (lVar70 - (cell->begin).y) * cell->jstride + lVar42 + lVar64) -
                      (long)(cell->begin).x].flag = 0x40003;
              piVar34[1] = piVar34[1] + 1;
            }
          }
          lVar64 = lVar64 + 1;
        } while (iVar63 + -2 + (int)lVar64 <= iVar32);
      }
      iVar33 = iVar33 + 1;
    }
    iVar30 = iVar30 + 1;
    lVar38 = lVar38 + 1;
  }
  if (extend_domain_face) {
    uVar23 = *(undefined8 *)((geom->domain).smallend.vect + 2);
    gdomain.bigend.vect[1] = (int)((ulong)*(undefined8 *)(geom->domain).bigend.vect >> 0x20);
    gdomain._20_8_ = *(undefined8 *)((geom->domain).bigend.vect + 2);
    gdomain.smallend.vect._0_8_ = *(undefined8 *)(geom->domain).smallend.vect;
    gdomain.smallend.vect[2] = (int)uVar23;
    gdomain.bigend.vect[0] = (int)((ulong)uVar23 >> 0x20);
    for (lVar38 = 0; lVar38 != 3; lVar38 = lVar38 + 1) {
      if (*(char *)((long)(geom->super_CoordSys).inv_dx + lVar38 + 0x19) == '\x01') {
        iVar30 = gdomain.smallend.vect[lVar38];
        iVar63 = gdomain.bigend.vect[lVar38];
        iVar31 = result.smallend.vect[lVar38];
        iVar32 = result.bigend.vect[lVar38];
        if (iVar31 < iVar30) {
          iVar30 = iVar31;
        }
        gdomain.smallend.vect[lVar38] = iVar30;
        if (iVar32 < iVar63) {
          iVar32 = iVar63;
        }
        gdomain.bigend.vect[lVar38] = iVar32;
      }
    }
    bVar27 = Box::contains(&gdomain,&result);
    if (!bVar27) {
      lVar38 = (long)result.smallend.vect[0];
      for (lVar42 = (long)result.smallend.vect[2]; iVar30 = (int)lVar42,
          lVar43 = (long)result.smallend.vect[1], iVar30 <= result.bigend.vect[2];
          lVar42 = lVar42 + 1) {
        for (; iVar63 = (int)lVar43, iVar63 <= result.bigend.vect[1]; lVar43 = lVar43 + 1) {
          lVar70 = cell->kstride;
          lVar72 = (lVar42 - (vcent->begin).z) * vcent->kstride;
          lVar48 = (lVar43 - (vcent->begin).y) * vcent->jstride;
          lVar35 = vcent->nstride;
          lVar73 = (lVar42 - (bcent->begin).z) * bcent->kstride;
          lVar50 = (lVar43 - (bcent->begin).y) * bcent->jstride;
          lVar36 = bcent->nstride;
          lVar74 = (lVar42 - (bnorm->begin).z) * bnorm->kstride;
          lVar71 = (lVar43 - (bnorm->begin).y) * bnorm->jstride;
          lVar64 = bnorm->nstride;
          lVar58 = (long)(cell->begin).y;
          iVar31 = (vfrac->begin).y;
          iVar32 = (barea->begin).y;
          iVar28 = (barea->begin).z;
          lVar47 = barea->kstride;
          iVar45 = (vfrac->begin).z;
          lVar37 = barea->jstride;
          iVar55 = (barea->begin).x;
          pdVar12 = barea->p;
          lVar39 = (long)(bnorm->begin).x;
          pdVar13 = bnorm->p;
          lVar49 = (long)(bcent->begin).x;
          pdVar14 = bcent->p;
          lVar52 = (long)(vcent->begin).x;
          pdVar15 = vcent->p;
          lVar59 = (long)(cell->begin).z;
          lVar44 = vfrac->kstride;
          lVar46 = vfrac->jstride;
          iVar56 = (vfrac->begin).x;
          pdVar21 = vfrac->p;
          lVar69 = (lVar42 - lVar59) * lVar70;
          lVar53 = cell->jstride;
          lVar54 = (lVar43 - lVar58) * lVar53;
          lVar61 = (long)(cell->begin).x;
          pEVar16 = cell->p;
          for (lVar75 = 0; iVar60 = result.smallend.vect[0] + (int)lVar75,
              iVar60 <= result.bigend.vect[0]; lVar75 = lVar75 + 1) {
            iVar33 = gdomain.bigend.vect[0];
            if (iVar60 < gdomain.bigend.vect[0]) {
              iVar33 = iVar60;
            }
            if (iVar60 < gdomain.smallend.vect[0]) {
              iVar33 = gdomain.smallend.vect[0];
            }
            iVar51 = gdomain.bigend.vect[1];
            if (iVar63 < gdomain.bigend.vect[1]) {
              iVar51 = iVar63;
            }
            if (iVar63 < gdomain.smallend.vect[1]) {
              iVar51 = gdomain.smallend.vect[1];
            }
            iVar68 = gdomain.smallend.vect[2];
            if (iVar30 < gdomain.smallend.vect[2]) {
LAB_004e0409:
              if (((~pEVar16[lVar38 + ((lVar69 + lVar54 + lVar75) - lVar61)].flag & 3) != 0) &&
                 ((~pEVar16[(iVar51 - lVar58) * lVar53 +
                            (iVar33 - lVar61) + (iVar68 - lVar59) * lVar70].flag & 3) == 0)) {
                *piVar34 = *piVar34 + 1;
                pdVar21[lVar38 + (((lVar42 - iVar45) * lVar44 + (lVar43 - iVar31) * lVar46 + lVar75)
                                 - (long)iVar56)] = 0.0;
                pdVar15[lVar38 + ((lVar72 + lVar48 + lVar75) - lVar52)] = 0.0;
                pdVar15[lVar38 + ((lVar35 + lVar72 + lVar48 + lVar75) - lVar52)] = 0.0;
                pdVar15[lVar38 + ((lVar72 + lVar48 + lVar35 * 2 + lVar75) - lVar52)] = 0.0;
                pdVar14[lVar38 + ((lVar73 + lVar50 + lVar75) - lVar49)] = -1.0;
                pdVar14[lVar38 + ((lVar36 + lVar73 + lVar50 + lVar75) - lVar49)] = -1.0;
                pdVar14[lVar38 + ((lVar73 + lVar50 + lVar36 * 2 + lVar75) - lVar49)] = -1.0;
                pdVar13[lVar38 + ((lVar74 + lVar71 + lVar75) - lVar39)] = 0.0;
                pdVar13[lVar38 + ((lVar64 + lVar74 + lVar71 + lVar75) - lVar39)] = 0.0;
                pdVar13[lVar38 + ((lVar74 + lVar71 + lVar64 * 2 + lVar75) - lVar39)] = 0.0;
                pdVar12[lVar38 + (((lVar42 - iVar28) * lVar47 + (lVar43 - iVar32) * lVar37 + lVar75)
                                 - (long)iVar55)] = 0.0;
                pEVar16[lVar38 + ((lVar69 + lVar54 + lVar75) - lVar61)].flag = 0x40003;
              }
            }
            else {
              iVar68 = gdomain.bigend.vect[2];
              if (iVar30 < gdomain.bigend.vect[2]) {
                iVar68 = iVar30;
              }
              if (((gdomain.bigend.vect[2] < iVar30) || (iVar63 < gdomain.smallend.vect[1])) ||
                 ((gdomain.bigend.vect[1] < iVar63 ||
                  ((iVar60 < gdomain.smallend.vect[0] || (gdomain.bigend.vect[0] < iVar60))))))
              goto LAB_004e0409;
            }
          }
        }
      }
    }
  }
  *nsmallcells = *nsmallcells + *piVar34;
  iVar30 = *nmulticuts + piVar34[1];
  *nmulticuts = iVar30;
  if (iVar30 < 1 && *nsmallcells < 1) {
    iVar30 = result.smallend.vect[2];
    while (iVar63 = iVar30, iVar63 <= result.bigend.vect[2]) {
      iVar30 = iVar63 + 1;
      lVar38 = (long)iVar63;
      iVar31 = result.smallend.vect[1];
      while (iVar32 = iVar31, iVar32 <= result.bigend.vect[1]) {
        pEVar16 = cell->p;
        lVar42 = cell->jstride;
        lVar43 = cell->kstride;
        puVar17 = fx->p;
        lVar70 = fx->jstride;
        lVar35 = fx->kstride;
        puVar18 = fy->p;
        lVar36 = fy->jstride;
        lVar64 = fy->kstride;
        iVar31 = iVar32 + 1;
        puVar19 = fz->p;
        lVar47 = fz->jstride;
        lVar37 = fz->kstride;
        pEVar20 = ctmp->p;
        lVar44 = ctmp->jstride;
        lVar46 = ctmp->kstride;
        lVar53 = (long)iVar32;
        for (iVar28 = result.smallend.vect[0]; iVar28 <= result.bigend.vect[0]; iVar28 = iVar28 + 1)
        {
          lVar58 = (long)iVar28;
          lVar69 = lVar58 - (cell->begin).x;
          lVar48 = (lVar53 - (cell->begin).y) * lVar42;
          lVar50 = (lVar38 - (cell->begin).z) * lVar43;
          uVar29 = pEVar16[lVar48 + lVar69 + lVar50].flag;
          if ((~uVar29 & 3) == 0) {
            uVar67 = uVar29 & 0x1f;
          }
          else {
            iVar45 = (fx->begin).x;
            uVar67 = (fx->begin).y;
            lVar52 = (long)(iVar28 - iVar45);
            lVar49 = (int)(iVar32 - uVar67) * lVar70;
            uVar62 = (fx->begin).z;
            lVar71 = (int)(iVar63 - uVar62) * lVar35;
            uVar4 = puVar17[lVar49 + lVar52 + lVar71];
            uVar57 = uVar29 & 0xfffdffff;
            if (uVar4 != 1) {
              uVar57 = uVar29;
            }
            iVar55 = iVar28 + 1;
            lVar54 = (long)(iVar55 - iVar45);
            uVar29 = puVar17[lVar49 + lVar54 + lVar71];
            uVar7 = uVar57 & 0xfff7ffff;
            if (uVar29 != 1) {
              uVar7 = uVar57;
            }
            uVar57 = (fy->begin).x;
            iVar45 = (fy->begin).y;
            lVar73 = (long)(int)(iVar28 - uVar57);
            lVar72 = (iVar32 - iVar45) * lVar36;
            uVar5 = (fy->begin).z;
            lVar59 = (int)(iVar63 - uVar5) * lVar64;
            uVar6 = puVar18[lVar72 + lVar73 + lVar59];
            uVar8 = uVar7 & 0xffff7fff;
            if (uVar6 != 1) {
              uVar8 = uVar7;
            }
            lVar74 = (iVar31 - iVar45) * lVar36;
            uVar7 = puVar18[lVar74 + lVar73 + lVar59];
            uVar11 = uVar8 & 0xffdfffff;
            if (uVar7 != 1) {
              uVar11 = uVar8;
            }
            uVar8 = (fz->begin).x;
            lVar61 = (long)(int)(iVar28 - uVar8);
            uVar9 = (fz->begin).y;
            lVar75 = (int)(iVar32 - uVar9) * lVar47;
            iVar45 = (fz->begin).z;
            lVar39 = (iVar63 - iVar45) * lVar37;
            uVar10 = puVar19[lVar75 + lVar61 + lVar39];
            uVar65 = uVar11 & 0xfffffdff;
            if (uVar10 != 1) {
              uVar65 = uVar11;
            }
            lVar40 = (iVar30 - iVar45) * lVar37;
            uVar11 = puVar19[lVar75 + lVar61 + lVar40];
            uVar66 = uVar65 & 0xf7ffffff;
            if (uVar11 != 1) {
              uVar66 = uVar65;
            }
            uVar65 = uVar66;
            if ((uVar4 == 1) || (puVar18[lVar72 + (int)(iVar28 + ~uVar57) + lVar59] == 1)) {
              if (uVar6 == 1) {
                uVar65 = uVar66 & 0xffffbfff;
              }
              if (puVar17[(int)(iVar32 + ~uVar67) * lVar70 + lVar52 + lVar71] == 1) {
                uVar65 = uVar66 & 0xffffbfff;
              }
            }
            uVar66 = uVar65;
            if ((uVar29 == 1) || (puVar18[lVar72 + (int)(iVar55 - uVar57) + lVar59] == 1)) {
              if (uVar6 == 1) {
                uVar66 = uVar65 & 0xfffeffff;
              }
              if (puVar17[(int)(~uVar67 + iVar32) * lVar70 + lVar54 + lVar71] == 1) {
                uVar66 = uVar65 & 0xfffeffff;
              }
            }
            uVar65 = uVar66;
            if ((uVar4 == 1) || (puVar18[lVar74 + (int)(~uVar57 + iVar28) + lVar59] == 1)) {
              if (uVar7 == 1) {
                uVar65 = uVar66 & 0xffefffff;
              }
              if (puVar17[(int)(iVar31 - uVar67) * lVar70 + lVar52 + lVar71] == 1) {
                uVar65 = uVar66 & 0xffefffff;
              }
            }
            uVar66 = uVar65;
            if ((uVar29 == 1) || (puVar18[lVar74 + (int)(iVar55 - uVar57) + lVar59] == 1)) {
              if (uVar7 == 1) {
                uVar66 = uVar65 & 0xffbfffff;
              }
              if (puVar17[(int)(iVar31 - uVar67) * lVar70 + lVar54 + lVar71] == 1) {
                uVar66 = uVar65 & 0xffbfffff;
              }
            }
            uVar67 = uVar66;
            if ((uVar4 == 1) || (puVar19[lVar75 + (int)(iVar28 + ~uVar8) + lVar39] == 1)) {
              if (uVar10 == 1) {
                uVar67 = uVar66 & 0xfffffeff;
              }
              if (puVar17[lVar49 + lVar52 + (int)(iVar63 + ~uVar62) * lVar35] == 1) {
                uVar67 = uVar66 & 0xfffffeff;
              }
            }
            if ((uVar29 == 1) || (puVar19[lVar75 + (int)(iVar55 - uVar8) + lVar39] == 1)) {
              uVar57 = uVar67 & 0xfffffbff;
              if (uVar10 == 1) {
                uVar67 = uVar57;
              }
              if (puVar17[lVar49 + lVar54 + (int)(~uVar62 + iVar63) * lVar35] == 1) {
                uVar67 = uVar57;
              }
            }
            uVar57 = uVar67;
            if ((uVar4 == 1) || (puVar19[lVar75 + (int)(iVar28 + ~uVar8) + lVar40] == 1)) {
              if (uVar11 == 1) {
                uVar57 = uVar67 & 0xfbffffff;
              }
              if (puVar17[lVar49 + lVar52 + (int)(iVar30 - uVar62) * lVar35] == 1) {
                uVar57 = uVar67 & 0xfbffffff;
              }
            }
            if ((uVar29 == 1) || (puVar19[lVar75 + (int)(iVar55 - uVar8) + lVar40] == 1)) {
              uVar29 = uVar57 & 0xefffffff;
              if (uVar11 == 1) {
                uVar57 = uVar29;
              }
              if (puVar17[lVar49 + lVar54 + (int)(iVar30 - uVar62) * lVar35] == 1) {
                uVar57 = uVar29;
              }
            }
            uVar29 = uVar57;
            if ((uVar6 == 1) || (puVar19[(int)(iVar32 + ~uVar9) * lVar47 + lVar61 + lVar39] == 1)) {
              if (uVar10 == 1) {
                uVar29 = uVar57 & 0xffffffbf;
              }
              if (puVar18[lVar72 + lVar73 + (int)(iVar63 + ~uVar5) * lVar64] == 1) {
                uVar29 = uVar57 & 0xffffffbf;
              }
            }
            uVar67 = uVar29;
            if ((uVar7 == 1) || (puVar19[(int)(iVar31 - uVar9) * lVar47 + lVar61 + lVar39] == 1)) {
              if (uVar10 == 1) {
                uVar67 = uVar29 & 0xffffefff;
              }
              if (puVar18[lVar74 + lVar73 + (int)(~uVar5 + iVar63) * lVar64] == 1) {
                uVar67 = uVar29 & 0xffffefff;
              }
            }
            uVar29 = uVar67;
            if ((uVar6 == 1) || (puVar19[(int)(~uVar9 + iVar32) * lVar47 + lVar61 + lVar40] == 1)) {
              if (uVar11 == 1) {
                uVar29 = uVar67 & 0xfeffffff;
              }
              if (puVar18[lVar72 + lVar73 + (int)(iVar30 - uVar5) * lVar64] == 1) {
                uVar29 = uVar67 & 0xfeffffff;
              }
            }
            uVar67 = uVar29;
            if ((uVar7 == 1) || (puVar19[(int)(iVar31 - uVar9) * lVar47 + lVar61 + lVar40] == 1)) {
              if (uVar11 == 1) {
                uVar67 = uVar29 & 0xbfffffff;
              }
              if (puVar18[lVar74 + lVar73 + (int)(iVar30 - uVar5) * lVar64] == 1) {
                uVar67 = uVar29 & 0xbfffffff;
              }
            }
          }
          pEVar16[lVar48 + lVar69 + lVar50].flag = uVar67;
          pEVar20[(lVar53 - (ctmp->begin).y) * lVar44 +
                  (lVar58 - (ctmp->begin).x) + (lVar38 - (ctmp->begin).z) * lVar46].flag =
               pEVar16[(lVar53 - (cell->begin).y) * lVar42 +
                       (lVar58 - (cell->begin).x) + (lVar38 - (cell->begin).z) * lVar43].flag;
        }
      }
    }
    iVar30 = (bx->smallend).vect[0];
    iVar63 = (bx->smallend).vect[1];
    local_340 = (bx->smallend).vect[2];
    iVar31 = (bx->bigend).vect[0];
    iVar32 = (bx->bigend).vect[1];
    iVar28 = (bx->bigend).vect[2];
    local_350 = local_340 + -1;
    lVar38 = (long)local_340;
    while( true ) {
      local_340 = local_340 + 1;
      if (iVar28 < (int)lVar38) break;
      lVar42 = (long)iVar63;
      iVar45 = iVar63 + -1;
      iVar55 = iVar63;
      while( true ) {
        iVar55 = iVar55 + 1;
        if (iVar32 < (int)lVar42) break;
        pEVar16 = cell->p;
        lVar35 = cell->jstride;
        lVar36 = cell->kstride;
        pEVar20 = ctmp->p;
        lVar64 = ctmp->jstride;
        lVar47 = ctmp->kstride;
        lVar43 = lVar47 * 4;
        lVar70 = lVar64 * 4;
        for (lVar37 = (long)iVar30; iVar56 = (int)lVar37, iVar56 <= iVar31; lVar37 = lVar37 + 1) {
          lVar44 = (long)(cell->begin).x;
          lVar46 = (lVar42 - (cell->begin).y) * lVar35 * 4 + (lVar38 - (cell->begin).z) * lVar36 * 4
          ;
          if ((~*(uint *)((long)&pEVar16[lVar37 - lVar44].flag + lVar46) & 3) != 0) {
            uVar29 = (ctmp->begin).x;
            lVar69 = (long)(int)uVar29;
            iVar60 = (ctmp->begin).y;
            lVar53 = ((long)(int)lVar42 - (long)iVar60) * lVar64;
            iVar33 = (ctmp->begin).z;
            lVar48 = ((long)(int)lVar38 - (long)iVar33) * lVar47;
            lVar50 = (lVar38 - iVar33) * lVar43;
            lVar58 = (lVar42 - iVar60) * lVar70;
            uVar67 = *(uint *)((long)&pEVar20[lVar37 - lVar69].flag + lVar50 + lVar58);
            sVar41 = (short)uVar67;
            uVar62 = uVar67;
            if (((((uVar67 >> 0x11 & 1) == 0) ||
                 ((pEVar20[lVar53 + (int)(~uVar29 + iVar56) + lVar48].flag & 0x40) == 0)) &&
                ((-1 < sVar41 ||
                 ((*(byte *)((long)&pEVar20[lVar37 - lVar69].flag +
                            (iVar45 - iVar60) * lVar70 + lVar50 + 1) & 1) == 0)))) &&
               (((uVar67 >> 9 & 1) == 0 ||
                ((*(byte *)((long)&pEVar20[lVar37 - lVar69].flag +
                           (local_350 - iVar33) * lVar43 + lVar58 + 1) & 0x40) == 0)))) {
              uVar62 = uVar67 & 0xffffffdf;
            }
            if (((((uVar67 >> 0x13 & 1) == 0) ||
                 ((pEVar20[lVar53 + (int)((iVar56 - uVar29) + 1) + lVar48].flag & 0x40) == 0)) &&
                ((-1 < sVar41 ||
                 ((*(byte *)((long)&pEVar20[lVar37 - lVar69].flag +
                            (iVar45 - iVar60) * lVar70 + lVar50 + 1) & 4) == 0)))) &&
               (((uVar67 >> 9 & 1) == 0 ||
                ((*(byte *)((long)&pEVar20[lVar37 - lVar69].flag +
                           (local_350 - iVar33) * lVar43 + lVar58 + 2) & 1) == 0)))) {
              uVar62 = uVar62 & 0xffffff7f;
            }
            if (((((uVar67 >> 0x11 & 1) == 0) ||
                 ((pEVar20[lVar53 + (int)(~uVar29 + iVar56) + lVar48].flag & 0x1000) == 0)) &&
                (((uVar67 >> 0x15 & 1) == 0 ||
                 ((*(byte *)((long)&pEVar20[lVar37 - lVar69].flag +
                            (iVar55 - iVar60) * lVar70 + lVar50 + 1) & 1) == 0)))) &&
               (((uVar67 >> 9 & 1) == 0 ||
                ((*(byte *)((long)&pEVar20[lVar37 - lVar69].flag +
                           (local_350 - iVar33) * lVar43 + lVar58 + 2) & 0x10) == 0)))) {
              uVar62 = uVar62 & 0xfffff7ff;
            }
            if (((((uVar67 >> 0x13 & 1) == 0) ||
                 ((pEVar20[lVar53 + (int)((iVar56 - uVar29) + 1) + lVar48].flag & 0x1000) == 0)) &&
                (((uVar67 >> 0x15 & 1) == 0 ||
                 ((*(byte *)((long)&pEVar20[lVar37 - lVar69].flag +
                            (iVar55 - iVar60) * lVar70 + lVar50 + 1) & 4) == 0)))) &&
               (((uVar67 >> 9 & 1) == 0 ||
                ((*(byte *)((long)&pEVar20[lVar37 - lVar69].flag +
                           (local_350 - iVar33) * lVar43 + lVar58 + 2) & 0x40) == 0)))) {
              uVar62 = uVar62 & 0xffffdfff;
            }
            if (((((uVar67 >> 0x11 & 1) == 0) ||
                 ((pEVar20[lVar53 + (int)(~uVar29 + iVar56) + lVar48].flag & 0x1000000) == 0)) &&
                ((-1 < sVar41 ||
                 ((*(byte *)((long)&pEVar20[lVar37 - lVar69].flag +
                            (iVar45 - iVar60) * lVar70 + lVar50 + 3) & 4) == 0)))) &&
               (((uVar67 >> 0x1b & 1) == 0 ||
                ((*(byte *)((long)&pEVar20[lVar37 - lVar69].flag +
                           (local_340 - iVar33) * lVar43 + lVar58 + 1) & 0x40) == 0)))) {
              uVar62 = uVar62 & 0xff7fffff;
            }
            if (((((uVar67 >> 0x13 & 1) == 0) ||
                 ((pEVar20[lVar53 + (int)((iVar56 - uVar29) + 1) + lVar48].flag & 0x1000000) == 0))
                && ((-1 < sVar41 ||
                    ((*(byte *)((long)&pEVar20[lVar37 - lVar69].flag +
                               (iVar45 - iVar60) * lVar70 + lVar50 + 3) & 0x10) == 0)))) &&
               (((uVar67 >> 0x1b & 1) == 0 ||
                ((*(byte *)((long)&pEVar20[lVar37 - lVar69].flag +
                           (local_340 - iVar33) * lVar43 + lVar58 + 2) & 1) == 0)))) {
              uVar62 = uVar62 & 0xfdffffff;
            }
            if (((((uVar67 >> 0x11 & 1) == 0) ||
                 ((pEVar20[lVar53 + (int)(~uVar29 + iVar56) + lVar48].flag & 0x40000000) == 0)) &&
                (((uVar67 >> 0x15 & 1) == 0 ||
                 ((*(byte *)((long)&pEVar20[lVar37 - lVar69].flag +
                            (iVar55 - iVar60) * lVar70 + lVar50 + 3) & 4) == 0)))) &&
               (((uVar67 >> 0x1b & 1) == 0 ||
                ((*(byte *)((long)&pEVar20[lVar37 - lVar69].flag +
                           (local_340 - iVar33) * lVar43 + lVar58 + 2) & 0x10) == 0)))) {
              uVar62 = uVar62 & 0xdfffffff;
            }
            if (((((uVar67 >> 0x13 & 1) == 0) ||
                 ((pEVar20[lVar53 + (int)((iVar56 - uVar29) + 1) + lVar48].flag & 0x40000000) == 0))
                && (((uVar67 >> 0x15 & 1) == 0 ||
                    ((*(byte *)((long)&pEVar20[lVar37 - lVar69].flag +
                               lVar50 + (iVar55 - iVar60) * lVar70 + 3) & 0x10) == 0)))) &&
               (((uVar67 >> 0x1b & 1) == 0 ||
                ((*(byte *)((long)&pEVar20[lVar37 - lVar69].flag +
                           lVar58 + (local_340 - iVar33) * lVar43 + 2) & 0x40) == 0)))) {
              uVar62 = uVar62 & 0x7fffffff;
            }
            *(uint *)((long)&pEVar16[lVar37 - lVar44].flag + lVar46) = uVar62;
          }
        }
        iVar45 = iVar45 + 1;
        lVar42 = lVar42 + 1;
      }
      local_350 = local_350 + 1;
      lVar38 = lVar38 + 1;
    }
  }
  else {
    if ((~cover_multiple_cuts & 0 < iVar30) == 1) {
      Abort_host("amrex::EB2::build_cells: multi-cuts not supported");
    }
    gdomain.bigend.vect[1] = result.bigend.vect[1];
    gdomain.bigend.vect[2] = result.bigend.vect[2];
    gdomain.btype.itype = result.btype.itype;
    gdomain.smallend.vect[0] = result.smallend.vect[0];
    gdomain.smallend.vect[1] = result.smallend.vect[1];
    gdomain.smallend.vect[2] = result.smallend.vect[2];
    gdomain.bigend.vect[0] = result.bigend.vect[0];
    for (lVar38 = 0; iVar63 = gdomain.bigend.vect[1], iVar30 = gdomain.bigend.vect[0], lVar38 != 3;
        lVar38 = lVar38 + 1) {
      if ((gdomain.btype.itype >> ((uint)lVar38 & 0x1f) & 1) == 0) {
        piVar34 = gdomain.bigend.vect + lVar38;
        *piVar34 = *piVar34 + 1;
      }
    }
    iVar31 = gdomain.bigend.vect[2];
    gdomain.btype.itype = 7;
    bx_2.bigend.vect[1] = result.bigend.vect[1];
    bx_2.bigend.vect[2] = result.bigend.vect[2];
    bx_2.btype.itype = result.btype.itype;
    uVar23 = bx_2._20_8_;
    bx_2.smallend.vect[0] = result.smallend.vect[0];
    bx_2.smallend.vect[1] = result.smallend.vect[1];
    bx_2.smallend.vect[2] = result.smallend.vect[2];
    bx_2.bigend.vect[0] = result.bigend.vect[0];
    bx_2.btype.itype = result.btype.itype;
    IVar26.itype = bx_2.btype.itype;
    bx_2._20_8_ = uVar23;
    if ((result._20_8_ & 0x100000000) == 0) {
      bx_2.bigend.vect[0] = result.bigend.vect[0] + 1;
      bx_2._20_8_ = result._20_8_ | 0x100000000;
    }
    bx_3.bigend.vect[1] = result.bigend.vect[1];
    bx_3.bigend.vect[2] = result.bigend.vect[2];
    bx_3.btype.itype = result.btype.itype;
    bx_3.smallend.vect[0] = result.smallend.vect[0];
    bx_3.smallend.vect[1] = result.smallend.vect[1];
    bx_3.smallend.vect[2] = result.smallend.vect[2];
    bx_3.bigend.vect[0] = result.bigend.vect[0];
    if ((result._20_8_ & 0x200000000) == 0) {
      bx_3.bigend.vect[1] = result.bigend.vect[1] + 1;
      bx_3._20_8_ = result._20_8_ | 0x200000000;
    }
    bx_4.bigend.vect[2] = result.bigend.vect[2];
    bx_4.btype.itype = result.btype.itype;
    bx_4.smallend.vect[0] = result.smallend.vect[0];
    bx_4.smallend.vect[1] = result.smallend.vect[1];
    bx_4.smallend.vect[2] = result.smallend.vect[2];
    bx_4.bigend.vect[1] = result.bigend.vect[1];
    bx_4.bigend.vect[0] = result.bigend.vect[0];
    if ((result._20_8_ & 0x400000000) == 0) {
      bx_4.bigend.vect[2] = result.bigend.vect[2];
      bx_4._20_8_ = CONCAT44(IVar26.itype,bx_4.bigend.vect[2] + 1) | 0x400000000;
    }
    lVar38 = (long)result.smallend.vect[0];
    lVar42 = (long)result.smallend.vect[1];
    iVar28 = result.smallend.vect[2] + -1;
    iVar32 = result.smallend.vect[1] + -1;
    for (lVar43 = (long)result.smallend.vect[2]; iVar45 = (int)lVar43, iVar45 <= iVar31;
        lVar43 = lVar43 + 1) {
      lVar35 = (long)iVar28;
      lVar36 = (long)iVar45;
      iVar56 = (int)(lVar36 + -1);
      iVar55 = iVar32;
      for (lVar70 = lVar42; iVar60 = (int)lVar70, iVar60 <= iVar63; lVar70 = lVar70 + 1) {
        lVar47 = (long)iVar55;
        lVar37 = (long)iVar60;
        iVar33 = (int)(lVar37 + -1);
        for (lVar64 = lVar38; iVar51 = (int)lVar64, iVar51 <= iVar30; lVar64 = lVar64 + 1) {
          if (0.0 < levset->p[((lVar43 - (levset->begin).z) * levset->kstride +
                              (lVar70 - (levset->begin).y) * levset->jstride + lVar64) -
                              (long)(levset->begin).x] ||
              levset->p[((lVar43 - (levset->begin).z) * levset->kstride +
                        (lVar70 - (levset->begin).y) * levset->jstride + lVar64) -
                        (long)(levset->begin).x] == 0.0) goto LAB_004e0052;
          iVar68 = iVar51 + -1;
          bVar27 = Box::contains(&result,iVar68,iVar33,iVar56);
          if (((((bVar27) &&
                ((~cell->p[((lVar37 + -1) - (long)(cell->begin).y) * cell->jstride +
                           (long)(~(cell->begin).x + iVar51) +
                           ((lVar36 + -1) - (long)(cell->begin).z) * cell->kstride].flag & 3) == 0))
               || ((bVar27 = Box::contains(&result,iVar51,iVar33,iVar56), bVar27 &&
                   ((~cell->p[((lVar35 - (cell->begin).z) * cell->kstride +
                              (lVar47 - (cell->begin).y) * cell->jstride + lVar64) -
                              (long)(cell->begin).x].flag & 3) == 0)))) ||
              (((bVar27 = Box::contains(&result,iVar68,iVar60,iVar56), bVar27 &&
                ((~cell->p[(lVar37 - (cell->begin).y) * cell->jstride +
                           (long)(~(cell->begin).x + iVar51) +
                           ((long)iVar56 - (long)(cell->begin).z) * cell->kstride].flag & 3) == 0))
               || ((bVar27 = Box::contains(&result,iVar51,iVar60,iVar56), bVar27 &&
                   ((~cell->p[((lVar70 - (cell->begin).y) * cell->jstride +
                              (lVar35 - (cell->begin).z) * cell->kstride + lVar64) -
                              (long)(cell->begin).x].flag & 3) == 0)))))) ||
             ((((bVar27 = Box::contains(&result,iVar68,iVar33,iVar45), bVar27 &&
                ((~cell->p[((long)iVar33 - (long)(cell->begin).y) * cell->jstride +
                           (long)(~(cell->begin).x + iVar51) +
                           (lVar36 - (cell->begin).z) * cell->kstride].flag & 3) == 0)) ||
               ((bVar27 = Box::contains(&result,iVar51,iVar33,iVar45), bVar27 &&
                ((~cell->p[((lVar43 - (cell->begin).z) * cell->kstride +
                           (lVar47 - (cell->begin).y) * cell->jstride + lVar64) -
                           (long)(cell->begin).x].flag & 3) == 0)))) ||
              ((bVar27 = Box::contains(&result,iVar68,iVar60,iVar45), bVar27 &&
               ((~cell->p[(lVar37 - (cell->begin).y) * cell->jstride +
                          (long)(~(cell->begin).x + iVar51) +
                          (lVar36 - (cell->begin).z) * cell->kstride].flag & 3) == 0)))))) {
LAB_004e0011:
            levset->p[((lVar43 - (levset->begin).z) * levset->kstride +
                      (lVar70 - (levset->begin).y) * levset->jstride + lVar64) -
                      (long)(levset->begin).x] = 0.0;
          }
          else {
            bVar27 = Box::contains(&result,iVar51,iVar60,iVar45);
            if (bVar27) {
              uVar29 = cell->p[((lVar43 - (cell->begin).z) * cell->kstride +
                               (lVar70 - (cell->begin).y) * cell->jstride + lVar64) -
                               (long)(cell->begin).x].flag & 3;
              if (cover_multiple_cuts && uVar29 != 3) {
LAB_004dfb8d:
                bVar27 = Box::contains(&bx_2,iVar51,iVar33,iVar56);
                if ((((((((bVar27) &&
                         (fx->p[((lVar35 - (fx->begin).z) * fx->kstride +
                                (lVar47 - (fx->begin).y) * fx->jstride + lVar64) -
                                (long)(fx->begin).x] == 1)) ||
                        ((bVar27 = Box::contains(&bx_2,iVar51,iVar60,iVar56), bVar27 &&
                         (fx->p[((lVar70 - (fx->begin).y) * fx->jstride +
                                (lVar35 - (fx->begin).z) * fx->kstride + lVar64) -
                                (long)(fx->begin).x] == 1)))) ||
                       ((bVar27 = Box::contains(&bx_2,iVar51,iVar33,iVar45), bVar27 &&
                        (fx->p[((lVar43 - (fx->begin).z) * fx->kstride +
                               (lVar47 - (fx->begin).y) * fx->jstride + lVar64) -
                               (long)(fx->begin).x] == 1)))) ||
                      (((bVar27 = Box::contains(&bx_2,iVar51,iVar60,iVar45), bVar27 &&
                        (fx->p[((lVar43 - (fx->begin).z) * fx->kstride +
                               (lVar70 - (fx->begin).y) * fx->jstride + lVar64) -
                               (long)(fx->begin).x] == 1)) ||
                       (((bVar27 = Box::contains(&bx_3,iVar68,iVar60,iVar56), bVar27 &&
                         (fy->p[(lVar37 - (fy->begin).y) * fy->jstride +
                                (long)(~(fy->begin).x + iVar51) +
                                ((long)iVar56 - (long)(fy->begin).z) * fy->kstride] == 1)) ||
                        ((bVar27 = Box::contains(&bx_3,iVar51,iVar60,iVar56), bVar27 &&
                         (fy->p[((lVar70 - (fy->begin).y) * fy->jstride +
                                (lVar35 - (fy->begin).z) * fy->kstride + lVar64) -
                                (long)(fy->begin).x] == 1)))))))) ||
                     ((bVar27 = Box::contains(&bx_3,iVar68,iVar60,iVar45), bVar27 &&
                      (fy->p[(lVar37 - (fy->begin).y) * fy->jstride +
                             (long)(~(fy->begin).x + iVar51) +
                             (lVar36 - (fy->begin).z) * fy->kstride] == 1)))) ||
                    ((bVar27 = Box::contains(&bx_3,iVar51,iVar60,iVar45), bVar27 &&
                     (fy->p[((lVar43 - (fy->begin).z) * fy->kstride +
                            (lVar70 - (fy->begin).y) * fy->jstride + lVar64) - (long)(fy->begin).x]
                      == 1)))) ||
                   (((((bVar27 = Box::contains(&bx_4,iVar68,iVar33,iVar45), bVar27 &&
                       (fz->p[((long)iVar33 - (long)(fz->begin).y) * fz->jstride +
                              (long)(~(fz->begin).x + iVar51) +
                              (lVar36 - (fz->begin).z) * fz->kstride] == 1)) ||
                      ((bVar27 = Box::contains(&bx_4,iVar51,iVar33,iVar45), bVar27 &&
                       (fz->p[((lVar43 - (fz->begin).z) * fz->kstride +
                              (lVar47 - (fz->begin).y) * fz->jstride + lVar64) - (long)(fz->begin).x
                             ] == 1)))) ||
                     ((bVar27 = Box::contains(&bx_4,iVar68,iVar60,iVar45), bVar27 &&
                      (fz->p[(lVar37 - (fz->begin).y) * fz->jstride +
                             (long)(~(fz->begin).x + iVar51) +
                             (lVar36 - (fz->begin).z) * fz->kstride] == 1)))) ||
                    ((bVar27 = Box::contains(&bx_4,iVar51,iVar60,iVar45), bVar27 &&
                     (fz->p[((lVar43 - (fz->begin).z) * fz->kstride +
                            (lVar70 - (fz->begin).y) * fz->jstride + lVar64) - (long)(fz->begin).x]
                      == 1)))))) goto LAB_004e0011;
              }
              else if (uVar29 == 3) goto LAB_004e0011;
            }
            else if (cover_multiple_cuts) goto LAB_004dfb8d;
          }
LAB_004e0052:
        }
        iVar55 = iVar55 + 1;
      }
      iVar28 = iVar28 + 1;
    }
  }
  Gpu::Buffer<int,_0>::clear(&n_smallcell_multicuts);
  return;
}

Assistant:

void build_cells (Box const& bx, Array4<EBCellFlag> const& cell,
                  Array4<Type_t> const& fx, Array4<Type_t> const& fy,
                  Array4<Type_t> const& fz, Array4<Real> const& apx,
                  Array4<Real> const& apy, Array4<Real> const& apz,
                  Array4<Real const> const& fcx, Array4<Real const> const& fcy,
                  Array4<Real const> const& fcz, Array4<Real const> const& m2x,
                  Array4<Real const> const& m2y, Array4<Real const> const& m2z,
                  Array4<Real> const& vfrac, Array4<Real> const& vcent,
                  Array4<Real> const& barea, Array4<Real> const& bcent,
                  Array4<Real> const& bnorm, Array4<EBCellFlag> const& ctmp,
                  Array4<Real> const& levset, Real small_volfrac, Geometry const& geom,
                  bool extend_domain_face, bool cover_multiple_cuts,
                  int& nsmallcells, int& nmulticuts) noexcept
{
    Gpu::Buffer<int> n_smallcell_multicuts = {0,0};
    int* hp = n_smallcell_multicuts.hostData();
    int* dp = n_smallcell_multicuts.data();

    const Box& bxg1 = amrex::grow(bx,1);
    AMREX_HOST_DEVICE_PARALLEL_FOR_3D(bxg1, i, j, k,
    {
        bool is_small_cell = false;
        bool is_multicut = false;
        set_eb_cell(i, j, k, cell, apx, apy, apz, fcx, fcy, fcz, m2x, m2y, m2z,
                    vfrac, vcent, barea, bcent, bnorm, small_volfrac,
                    is_small_cell, is_multicut);
        if (is_small_cell) {
            Gpu::Atomic::Add(dp, 1);
        }
        if (is_multicut) {
            Gpu::Atomic::Add(dp+1, 1);
        }
    });

    // set cells in the extended region to covered if the
    // corresponding cell on the domain face is covered
    if(extend_domain_face) {

       Box gdomain = geom.Domain();
       for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
           if (geom.isPeriodic(idim)) {
               gdomain.setSmall(idim, std::min(gdomain.smallEnd(idim), bxg1.smallEnd(idim)));
               gdomain.setBig(idim, std::max(gdomain.bigEnd(idim), bxg1.bigEnd(idim)));
           }
       }

       if (! gdomain.contains(bxg1)) {
          AMREX_HOST_DEVICE_FOR_3D ( bxg1, i, j, k,
          {
              const auto & dlo = gdomain.loVect();
              const auto & dhi = gdomain.hiVect();

              // find the cell(ii,jj,kk) on the corr. domain face
              // this would have already been set to correct value
              bool in_extended_domain = false;
              int ii = i;
              int jj = j;
              int kk = k;
              if(i < dlo[0]) {
                  in_extended_domain = true;
                  ii = dlo[0];
              }
              else if(i > dhi[0]) {
                  in_extended_domain = true;
                  ii = dhi[0];
              }

              if(j < dlo[1]) {
                  in_extended_domain = true;
                  jj = dlo[1];
              }
              else if(j > dhi[1]) {
                  in_extended_domain = true;
                  jj = dhi[1];
              }

              if(k < dlo[2]) {
                  in_extended_domain = true;
                  kk = dlo[2];
              }
              else if(k > dhi[2]) {
                  in_extended_domain = true;
                  kk = dhi[2];
              }

              // set cell in extendable region to covered if necessary
              if( in_extended_domain && (! cell(i,j,k).isCovered())
                  && cell(ii,jj,kk).isCovered() )
              {
                  Gpu::Atomic::Add(dp, 1);
                  set_covered(i,j,k,cell,vfrac,vcent,barea,bcent,bnorm);
              }
          });
       }
    }

    n_smallcell_multicuts.copyToHost();
    nsmallcells += hp[0];
    nmulticuts  += hp[1];

    if (nsmallcells > 0 || nmulticuts > 0) {
        if (!cover_multiple_cuts && nmulticuts > 0) {
            amrex::Abort("amrex::EB2::build_cells: multi-cuts not supported");
        }
        Box const& nbxg1 = amrex::surroundingNodes(bxg1);
        Box const& bxg1x = amrex::surroundingNodes(bxg1,0);
        Box const& bxg1y = amrex::surroundingNodes(bxg1,1);
        Box const& bxg1z = amrex::surroundingNodes(bxg1,2);
        AMREX_HOST_DEVICE_FOR_3D(nbxg1, i, j, k,
        {
            if (levset(i,j,k) < Real(0.0)) {
                bool zero_levset = false;
                if        (bxg1.contains(i-1,j-1,k-1)
                           &&       cell(i-1,j-1,k-1).isCovered()) {
                    zero_levset = true;
                } else if (bxg1.contains(i  ,j-1,k-1)
                           &&       cell(i  ,j-1,k-1).isCovered()) {
                    zero_levset = true;
                } else if (bxg1.contains(i-1,j  ,k-1)
                           &&       cell(i-1,j  ,k-1).isCovered()) {
                    zero_levset = true;
                } else if (bxg1.contains(i  ,j  ,k-1)
                           &&       cell(i  ,j  ,k-1).isCovered()) {
                    zero_levset = true;
                } else if (bxg1.contains(i-1,j-1,k  )
                           &&       cell(i-1,j-1,k  ).isCovered()) {
                    zero_levset = true;
                } else if (bxg1.contains(i  ,j-1,k  )
                           &&       cell(i  ,j-1,k  ).isCovered()) {
                    zero_levset = true;
                } else if (bxg1.contains(i-1,j  ,k  )
                           &&       cell(i-1,j  ,k  ).isCovered()) {
                    zero_levset = true;
                } else if (bxg1.contains(i  ,j  ,k  )
                           &&       cell(i  ,j  ,k  ).isCovered()) {
                    zero_levset = true;
                } else if (cover_multiple_cuts) {
                    if        (bxg1x.contains(i  ,j-1,k-1)
                               &&          fx(i  ,j-1,k-1) == Type::covered) {
                        zero_levset = true;
                    } else if (bxg1x.contains(i  ,j  ,k-1)
                               &&          fx(i  ,j  ,k-1) == Type::covered) {
                        zero_levset = true;
                    } else if (bxg1x.contains(i  ,j-1,k  )
                               &&          fx(i  ,j-1,k  ) == Type::covered) {
                        zero_levset = true;
                    } else if (bxg1x.contains(i  ,j  ,k  )
                               &&          fx(i  ,j  ,k  ) == Type::covered) {
                        zero_levset = true;
                    } else if (bxg1y.contains(i-1,j  ,k-1)
                               &&          fy(i-1,j  ,k-1) == Type::covered) {
                        zero_levset = true;
                    } else if (bxg1y.contains(i  ,j  ,k-1)
                               &&          fy(i  ,j  ,k-1) == Type::covered) {
                        zero_levset = true;
                    } else if (bxg1y.contains(i-1,j  ,k  )
                               &&          fy(i-1,j  ,k  ) == Type::covered) {
                        zero_levset = true;
                    } else if (bxg1y.contains(i  ,j  ,k  )
                               &&          fy(i  ,j  ,k  ) == Type::covered) {
                        zero_levset = true;
                    } else if (bxg1z.contains(i-1,j-1,k  )
                               &&          fz(i-1,j-1,k  ) == Type::covered) {
                        zero_levset = true;
                    } else if (bxg1z.contains(i  ,j-1,k  )
                               &&          fz(i  ,j-1,k  ) == Type::covered) {
                        zero_levset = true;
                    } else if (bxg1z.contains(i-1,j  ,k  )
                               &&          fz(i-1,j  ,k  ) == Type::covered) {
                        zero_levset = true;
                    } else if (bxg1z.contains(i  ,j  ,k  )
                               &&          fz(i  ,j  ,k  ) == Type::covered) {
                        zero_levset = true;
                    }
                }
                if (zero_levset) {
                    levset(i,j,k) = Real(0.0);
                }
            }
        });
        return;
    }

    // Build neighbors.  By default all 26 neighbors are already set.
    AMREX_HOST_DEVICE_FOR_3D ( bxg1, i, j, k,
    {
        if (cell(i,j,k).isCovered()) {
            cell(i,j,k).setDisconnected();
        } else {
            auto flg = cell(i,j,k);

            if (fx(i,j,k) == Type::covered) {
                flg.setDisconnected(-1,0,0);
            }
            if (fx(i+1,j,k) == Type::covered) {
                flg.setDisconnected(1,0,0);
            }
            if (fy(i,j,k) == Type::covered) {
                flg.setDisconnected(0,-1,0);
            }
            if (fy(i,j+1,k) == Type::covered) {
                flg.setDisconnected(0,1,0);
            }
            if (fz(i,j,k) == Type::covered) {
                flg.setDisconnected(0,0,-1);
            }
            if (fz(i,j,k+1) == Type::covered) {
                flg.setDisconnected(0,0,1);
            }

            // x-y
            if ((fx(i,j,k) == Type::covered || fy(i-1,j,k) == Type::covered) &&
                (fx(i,j-1,k) == Type::covered || fy(i,j,k) == Type::covered))
            {
                flg.setDisconnected(-1,-1,0);
            }

            if ((fx(i+1,j,k) == Type::covered || fy(i+1,j,k) == Type::covered) &&
                (fx(i+1,j-1,k) == Type::covered || fy(i,j,k) == Type::covered))
            {
                flg.setDisconnected(1,-1,0);
            }

            if ((fx(i,j,k) == Type::covered || fy(i-1,j+1,k) == Type::covered) &&
                (fx(i,j+1,k) == Type::covered || fy(i,j+1,k) == Type::covered))
            {
                flg.setDisconnected(-1,1,0);
            }

            if ((fx(i+1,j,k) == Type::covered || fy(i+1,j+1,k) == Type::covered) &&
                (fx(i+1,j+1,k) == Type::covered || fy(i,j+1,k) == Type::covered))
            {
                flg.setDisconnected(1,1,0);
            }

            // x-z
            if ((fx(i,j,k) == Type::covered || fz(i-1,j,k) == Type::covered) &&
                (fx(i,j,k-1) == Type::covered || fz(i,j,k) == Type::covered))
            {
                flg.setDisconnected(-1,0,-1);
            }

            if ((fx(i+1,j,k) == Type::covered || fz(i+1,j,k) == Type::covered) &&
                (fx(i+1,j,k-1) == Type::covered || fz(i,j,k) == Type::covered))
            {
                flg.setDisconnected(1,0,-1);
            }

            if ((fx(i,j,k) == Type::covered || fz(i-1,j,k+1) == Type::covered) &&
                (fx(i,j,k+1) == Type::covered || fz(i,j,k+1) == Type::covered))
            {
                flg.setDisconnected(-1,0,1);
            }

            if ((fx(i+1,j,k) == Type::covered || fz(i+1,j,k+1) == Type::covered) &&
                (fx(i+1,j,k+1) == Type::covered || fz(i,j,k+1) == Type::covered))
            {
                flg.setDisconnected(1,0,1);
            }

            // y-z
            if ((fy(i,j,k) == Type::covered || fz(i,j-1,k) == Type::covered) &&
                (fy(i,j,k-1) == Type::covered || fz(i,j,k) == Type::covered))
            {
                flg.setDisconnected(0,-1,-1);
            }

            if ((fy(i,j+1,k) == Type::covered || fz(i,j+1,k) == Type::covered) &&
                (fy(i,j+1,k-1) == Type::covered || fz(i,j,k) == Type::covered))
            {
                flg.setDisconnected(0,1,-1);
            }

            if ((fy(i,j,k) == Type::covered || fz(i,j-1,k+1) == Type::covered) &&
                (fy(i,j,k+1) == Type::covered || fz(i,j,k+1) == Type::covered))
            {
                flg.setDisconnected(0,-1,1);
            }

            if ((fy(i,j+1,k) == Type::covered || fz(i,j+1,k+1) == Type::covered) &&
                (fy(i,j+1,k+1) == Type::covered || fz(i,j,k+1) == Type::covered))
            {
                flg.setDisconnected(0,1,1);
            }

            cell(i,j,k) = flg;
        }

        ctmp(i,j,k) = cell(i,j,k);
    });

    AMREX_HOST_DEVICE_FOR_3D ( bx, i, j, k,
    {
        if (!cell(i,j,k).isCovered()) {
            auto tmpflg = ctmp(i,j,k);
            auto newflg = tmpflg;

            // -1, -1, -1 corner
            if ((tmpflg.isDisconnected(-1, 0, 0) || ctmp(i-1,j  ,k  ).isDisconnected( 0,-1,-1)) &&
                (tmpflg.isDisconnected( 0,-1, 0) || ctmp(i  ,j-1,k  ).isDisconnected(-1, 0,-1)) &&
                (tmpflg.isDisconnected( 0, 0,-1) || ctmp(i  ,j  ,k-1).isDisconnected(-1,-1, 0)))
            {
                newflg.setDisconnected(-1,-1,-1);
            }

            // 1, -1, -1 corner
            if ((tmpflg.isDisconnected( 1, 0, 0) || ctmp(i+1,j  ,k  ).isDisconnected( 0,-1,-1)) &&
                (tmpflg.isDisconnected( 0,-1, 0) || ctmp(i  ,j-1,k  ).isDisconnected( 1, 0,-1)) &&
                (tmpflg.isDisconnected( 0, 0,-1) || ctmp(i  ,j  ,k-1).isDisconnected( 1,-1, 0)))
            {
                newflg.setDisconnected(1,-1,-1);
            }

            // -1, 1, -1 corner
            if ((tmpflg.isDisconnected(-1, 0, 0) || ctmp(i-1,j  ,k  ).isDisconnected( 0, 1,-1)) &&
                (tmpflg.isDisconnected( 0, 1, 0) || ctmp(i  ,j+1,k  ).isDisconnected(-1, 0,-1)) &&
                (tmpflg.isDisconnected( 0, 0,-1) || ctmp(i  ,j  ,k-1).isDisconnected(-1, 1, 0)))
            {
                newflg.setDisconnected(-1, 1,-1);
            }

            // 1, 1, -1 corner
            if ((tmpflg.isDisconnected( 1, 0, 0) || ctmp(i+1,j  ,k  ).isDisconnected( 0, 1,-1)) &&
                (tmpflg.isDisconnected( 0, 1, 0) || ctmp(i  ,j+1,k  ).isDisconnected( 1, 0,-1)) &&
                (tmpflg.isDisconnected( 0, 0,-1) || ctmp(i  ,j  ,k-1).isDisconnected( 1, 1, 0)))
            {
                newflg.setDisconnected(1, 1,-1);
            }

            // -1, -1, 1 corner
            if ((tmpflg.isDisconnected(-1, 0, 0) || ctmp(i-1,j  ,k  ).isDisconnected( 0,-1, 1)) &&
                (tmpflg.isDisconnected( 0,-1, 0) || ctmp(i  ,j-1,k  ).isDisconnected(-1, 0, 1)) &&
                (tmpflg.isDisconnected( 0, 0, 1) || ctmp(i  ,j  ,k+1).isDisconnected(-1,-1, 0)))
            {
                newflg.setDisconnected(-1,-1, 1);
            }

            // 1, -1, 1 corner
            if ((tmpflg.isDisconnected( 1, 0, 0) || ctmp(i+1,j  ,k  ).isDisconnected( 0,-1, 1)) &&
                (tmpflg.isDisconnected( 0,-1, 0) || ctmp(i  ,j-1,k  ).isDisconnected( 1, 0, 1)) &&
                (tmpflg.isDisconnected( 0, 0, 1) || ctmp(i  ,j  ,k+1).isDisconnected( 1,-1, 0)))
            {
                newflg.setDisconnected(1,-1, 1);
            }

            // -1, 1, 1 corner
            if ((tmpflg.isDisconnected(-1, 0, 0) || ctmp(i-1,j  ,k  ).isDisconnected( 0, 1, 1)) &&
                (tmpflg.isDisconnected( 0, 1, 0) || ctmp(i  ,j+1,k  ).isDisconnected(-1, 0, 1)) &&
                (tmpflg.isDisconnected( 0, 0, 1) || ctmp(i  ,j  ,k+1).isDisconnected(-1, 1, 0)))
            {
                newflg.setDisconnected(-1,1,1);
            }

            // 1, 1, 1 corner
            if ((tmpflg.isDisconnected( 1, 0, 0) || ctmp(i+1,j  ,k  ).isDisconnected( 0, 1, 1)) &&
                (tmpflg.isDisconnected( 0, 1, 0) || ctmp(i  ,j+1,k  ).isDisconnected( 1, 0, 1)) &&
                (tmpflg.isDisconnected( 0, 0, 1) || ctmp(i  ,j  ,k+1).isDisconnected( 1, 1, 0)))
            {
                newflg.setDisconnected(1,1,1);
            }

            cell(i,j,k) = newflg;
        }
    });
}